

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

void Abc_BufCollectTfiCone(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  ulong uVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  int *piVar4;
  int iVar5;
  
  p->vTfCone->nSize = 0;
  pAVar3 = p->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar2 = pAVar3->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar5 = (int)uVar1;
    if ((pAVar3->vTravIds).nCap < iVar5) {
      piVar4 = (int *)malloc(uVar1 * 4);
      (pAVar3->vTravIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar5;
    }
    if (-500 < iVar2) {
      memset((pAVar3->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pAVar3->vTravIds).nSize = iVar5;
  }
  iVar2 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    Abc_BufCollectTfiCone_rec(pObj,p->vTfCone);
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void Abc_BufCollectTfiCone( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Vec_IntClear( p->vTfCone );
    Abc_NtkIncrementTravId( p->pNtk );
    Abc_BufCollectTfiCone_rec( pObj, p->vTfCone );
}